

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O3

void __thiscall n_pca::NPca::process(NPca *this)

{
  MatrixXd *pMVar1;
  double *pdVar2;
  pointer pcVar3;
  double *pdVar4;
  double *pdVar5;
  void *pvVar6;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar7;
  undefined8 *puVar8;
  char *pcVar9;
  Index index_1;
  ulong uVar10;
  ulong uVar11;
  Index index_2;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Index index;
  ulong uVar15;
  ActualDstType actualDst_1;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  RowVectorXd mean_vec_row;
  MatrixXd basic_squre_matrix;
  MatrixXd train_zero_matrix;
  MatrixXd PC;
  MatrixXd C;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eigenSolver;
  scalar_sum_op<double,_double> local_199;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_198;
  void *local_158;
  ulong uStack_150;
  void *local_140;
  ulong local_138;
  long local_130;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  MatrixXd *local_110;
  undefined1 local_108 [16];
  variable_if_dynamic<long,__1> local_f8;
  void *local_f0;
  ulong local_e8;
  void *local_d8 [3];
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c0;
  string local_70;
  string local_50;
  
  pcVar3 = (this->n_config_->train_file_path_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,
             pcVar3 + (this->n_config_->train_file_path_)._M_string_length);
  setTrainMatrix(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar3 = (this->n_config_->test_file_path_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->n_config_->test_file_path_)._M_string_length
            );
  setTestMatrix(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  puts("finished load set...");
  lVar16 = (this->train_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if (lVar16 < 0) {
    pcVar9 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
    ;
LAB_001043e2:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar9);
  }
  local_c0.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)
         (double)(this->train_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)&this->train_matrix_;
  local_c0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = lVar16;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&this->train_mean_,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
              *)&local_c0,(assign_op<double,_double> *)&local_198);
  uVar10 = (this->train_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if ((long)uVar10 < 0) {
    __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, 1, -1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, 1, -1>>, Level = 0]"
                 );
  }
  pdVar4 = (this->train_mean_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  local_158 = (void *)0x0;
  uStack_150 = 0;
  if (uVar10 == 0) {
    uVar15 = 0;
LAB_00103e89:
    if ((long)uVar15 < (long)uVar10) {
      do {
        *(double *)((long)local_158 + uVar15 * 8) = pdVar4[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar10 != uVar15);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_128,(DenseStorage<double,__1,__1,__1,_0> *)&this->train_matrix_);
    local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_128;
    Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-=
              ((VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_c0,
               (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_158);
    local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_128;
    local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)&local_128;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                *)&local_c0);
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_c0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8,0x80);
    pPVar7 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                       (&local_c0);
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_ =
         SEXT48(this->n_config_->dimension_);
    uVar10 = *(long *)(pPVar7 + 0x10) -
             local_198.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             _16_8_;
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
    m_value = *(long *)(pPVar7 + 8);
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)
         (*(long *)pPVar7 +
         local_198.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value * uVar10 * 8);
    if ((local_198.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value |
        local_198.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_
        ) < 0 && *(long *)pPVar7 != 0) {
      pcVar9 = 
      "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>, Level = 0]"
      ;
LAB_00104385:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar9);
    }
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
         (XprTypeNested)pPVar7;
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
    m_value = uVar10;
    local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_outerStride
         = local_198.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
    if ((local_198.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value < 0) ||
       ((long)(uVar10 | local_198.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                        ._16_8_) < 0)) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = true]"
                   );
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>
                *)&local_198);
    puts("finished reduce dimension...");
    if (local_128.m_rows == local_e8) {
      local_108._0_8_ = &local_128;
      local_108._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_198,
                 (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                  *)local_108);
      pMVar1 = &this->basic_matrix_;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (pMVar1,(Matrix<double,__1,__1,_0,__1,__1> *)&local_198,
                 (assign_op<double,_double> *)&local_140);
      free(local_198.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data);
      local_198.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)pMVar1;
      local_110 = pMVar1;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_140,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_198);
      uVar10 = (this->basic_matrix_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      if (0 < (long)uVar10) {
        lVar16 = 0;
        uVar14 = 0;
        do {
          pdVar4 = (this->basic_matrix_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          ;
          uVar10 = (this->basic_matrix_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((long)uVar10 < 0 && pdVar4 != (double *)0x0) {
LAB_00104370:
            pcVar9 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
            ;
            goto LAB_00104385;
          }
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data = (PointerType)((long)local_140 + local_138 * uVar14 * 8);
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value = local_138;
          if ((long)local_138 < 0 && local_140 != (void *)0x0) goto LAB_00104370;
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startRow.m_value = 0;
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_outerStride = local_138;
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
               (XprTypeNested)&local_140;
          local_198.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startCol.m_value = uVar14;
          if (local_130 <= (long)uVar14) {
LAB_0010438f:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          if (local_138 == 0) {
            dVar17 = 0.0;
          }
          else {
            if ((long)local_138 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::redux(const Func &) const [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_f8.m_value = local_138;
            local_108._0_8_ =
                 local_198.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                 .m_data;
            dVar17 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>,3,0>
                     ::run<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                               ((redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                 *)local_108,&local_199,&local_198);
          }
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          if ((long)uVar10 < 0) {
            pcVar9 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_001043e2;
          }
          pdVar5 = (this->basic_matrix_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          ;
          uVar15 = (this->basic_matrix_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((long)uVar15 < 0 && pdVar5 != (double *)0x0) goto LAB_00104370;
          if ((this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_storage.m_cols <= (long)uVar14) goto LAB_0010438f;
          if (uVar15 != uVar10) {
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                          "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                         );
          }
          uVar11 = uVar10;
          if ((((ulong)(pdVar5 + uVar15 * uVar14) & 7) == 0) &&
             (uVar11 = (ulong)((uint)((ulong)(pdVar5 + uVar15 * uVar14) >> 3) & 1), uVar10 <= uVar11
             )) {
            uVar11 = uVar10;
          }
          if (uVar11 != 0) {
            uVar13 = 0;
            do {
              *(double *)((long)pdVar5 + uVar13 * 8 + uVar15 * lVar16) =
                   *(double *)((long)pdVar4 + uVar13 * 8 + uVar10 * lVar16) / dVar17;
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
          }
          lVar12 = uVar10 - uVar11;
          uVar13 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
          if (1 < lVar12) {
            do {
              auVar18._8_8_ = dVar17;
              auVar18._0_8_ = dVar17;
              auVar18 = divpd(*(undefined1 (*) [16])((long)pdVar4 + uVar11 * 8 + uVar10 * lVar16),
                              auVar18);
              *(undefined1 (*) [16])((long)pdVar5 + uVar11 * 8 + uVar15 * lVar16) = auVar18;
              uVar11 = uVar11 + 2;
            } while ((long)uVar11 < (long)uVar13);
          }
          if ((long)uVar13 < (long)uVar10) {
            do {
              *(double *)((long)pdVar5 + uVar13 * 8 + uVar15 * lVar16) =
                   *(double *)((long)pdVar4 + uVar13 * 8 + uVar10 * lVar16) / dVar17;
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
          uVar14 = uVar14 + 1;
          uVar10 = (this->basic_matrix_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          ;
          lVar16 = lVar16 + 8;
        } while ((long)uVar14 < (long)uVar10);
      }
      pMVar1 = local_110;
      if (local_128.m_cols ==
          (this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows) {
        local_198.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (PointerType)0x0;
        local_198.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = 0;
        local_198.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_
             = 0;
        if ((local_128.m_rows | uVar10) != 0) {
          if ((long)(local_128.m_rows | uVar10) < 0) {
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                         );
          }
          if ((local_128.m_rows != 0 && uVar10 != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar10),0) <
              local_128.m_rows)) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar8 = __cxa_throw;
            __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)&local_198,local_128.m_rows * uVar10,
                     local_128.m_rows,uVar10);
        }
        Eigen::internal::
        generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_198,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_128,pMVar1);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (&this->train_data_matrix_,(Matrix<double,__1,__1,_0,__1,__1> *)&local_198,
                   (assign_op<double,_double> *)local_108);
        free(local_198.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_data);
        puts("finished process...");
        saveData(this);
        free(local_140);
        free(local_f0);
        free(local_c0.m_hcoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_c0.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_c0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(local_d8[0]);
        free(local_128.m_data);
        free(local_158);
        return;
      }
      pcVar9 = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
      ;
    }
    else {
      pcVar9 = 
      "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
      ;
    }
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar9);
  }
  if (uVar10 < 0x2000000000000000) {
    pvVar6 = malloc(uVar10 * 8);
    if (uVar10 != 1 && ((ulong)pvVar6 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pvVar6 != (void *)0x0) {
      local_158 = pvVar6;
      uStack_150 = uVar10;
      if (uVar10 == 1) {
        uVar15 = 0;
      }
      else {
        uVar15 = uVar10 & 0x1ffffffffffffffe;
        uVar14 = 0;
        do {
          pdVar5 = pdVar4 + uVar14;
          dVar17 = pdVar5[1];
          pdVar2 = (double *)((long)pvVar6 + uVar14 * 8);
          *pdVar2 = *pdVar5;
          pdVar2[1] = dVar17;
          uVar14 = uVar14 + 2;
        } while (uVar14 < uVar15);
      }
      goto LAB_00103e89;
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = __cxa_throw;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void NPca::process()
{
    setTrainMatrix(n_config_->train_file_path_);
    setTestMatrix(n_config_->test_file_path_);

    printf("finished load set...\n");

    train_mean_ = train_matrix_.colwise().mean();

    RowVectorXd mean_vec_row(RowVectorXd::Map(train_mean_.data(), train_matrix_.cols()));

    MatrixXd train_zero_matrix = train_matrix_;
    train_zero_matrix.rowwise() -= mean_vec_row;

    // calculate covariance
    MatrixXd C = train_zero_matrix * train_zero_matrix.transpose();

    // calculate feature vector and value
    Eigen::SelfAdjointEigenSolver<MatrixXd> eigenSolver(C);

    // reduce dimension
    MatrixXd PC = eigenSolver.eigenvectors().rightCols(n_config_->dimension_);
    printf("finished reduce dimension...\n");

    basic_matrix_ = train_zero_matrix.transpose() * PC;

    MatrixXd basic_squre_matrix = basic_matrix_.array().square();

    // normalization
    for (int i = 0; i < basic_matrix_.cols(); i++)
    {
        basic_matrix_.col(i) = basic_matrix_.col(i)/sqrt(basic_squre_matrix.col(i).sum());
    }

    train_data_matrix_ = train_zero_matrix * basic_matrix_;

    printf("finished process...\n");

    saveData();
}